

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MethodBuilder.cpp
# Opt level: O1

size_t __thiscall Lodtalk::MethodAssembler::Assembler::addLiteral(Assembler *this,Oop newLiteral)

{
  anon_union_8_4_0eb573b0_for_Oop_0 *paVar1;
  ulong uVar2;
  anon_union_8_4_0eb573b0_for_Oop_0 *paVar3;
  ulong uVar4;
  bool bVar5;
  anon_union_8_4_0eb573b0_for_Oop_0 local_38;
  VMContext *local_30;
  
  paVar3 = (anon_union_8_4_0eb573b0_for_Oop_0 *)
           (this->literals).super__Vector_base<Lodtalk::OopRef,_std::allocator<Lodtalk::OopRef>_>.
           _M_impl.super__Vector_impl_data._M_start;
  paVar1 = (anon_union_8_4_0eb573b0_for_Oop_0 *)
           (this->literals).super__Vector_base<Lodtalk::OopRef,_std::allocator<Lodtalk::OopRef>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  uVar4 = (long)paVar1 - (long)paVar3 >> 5;
  bVar5 = paVar1 != paVar3;
  if (bVar5) {
    if ((anon_union_8_4_0eb573b0_for_Oop_0)paVar3->pointer == newLiteral.field_0) {
      uVar2 = 0;
    }
    else {
      uVar2 = 0;
      do {
        paVar3 = paVar3 + 4;
        if ((uVar4 + (uVar4 == 0)) - 1 == uVar2) goto LAB_0013d8a8;
        uVar2 = uVar2 + 1;
      } while ((anon_union_8_4_0eb573b0_for_Oop_0)paVar3->pointer != newLiteral.field_0);
      bVar5 = uVar2 < uVar4;
    }
    if (bVar5) {
      return uVar2;
    }
  }
LAB_0013d8a8:
  local_38 = newLiteral.field_0;
  local_30 = getCurrentContext();
  OopRef::registerSelf((OopRef *)&local_38);
  std::vector<Lodtalk::OopRef,_std::allocator<Lodtalk::OopRef>_>::emplace_back<Lodtalk::OopRef>
            (&this->literals,(OopRef *)&local_38);
  OopRef::unregisterSelf((OopRef *)&local_38);
  return uVar4;
}

Assistant:

size_t Assembler::addLiteral(Oop newLiteral)
{
	for (size_t i = 0; i < literals.size(); ++i)
	{
		if(literals[i] == newLiteral)
			return i;
	}

	auto ret = literals.size();
	literals.push_back(newLiteral);
	return ret;
}